

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O2

void __thiscall
Expression::Expression(Expression *this,BotscriptParser *parser,Lexer *lx,DataType reqtype)

{
  SymbolList *this_00;
  bool bVar1;
  undefined3 in_register_00000009;
  undefined4 uVar2;
  undefined4 in_register_0000000c;
  uchar *sig;
  BotscriptParser *args;
  uchar *in_R8;
  size_t in_R9;
  ExpressionSymbol *sym;
  ExpressionSymbol *local_30;
  
  uVar2 = CONCAT31(in_register_00000009,reqtype);
  this->m_parser = parser;
  this->m_lexer = lx;
  this_00 = &this->m_symbols;
  std::_Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>::_Deque_base
            ((_Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_> *)this_00);
  this->m_type = reqtype;
  (this->m_badTokenText)._string._M_dataplus._M_p = (pointer)&(this->m_badTokenText)._string.field_2
  ;
  (this->m_badTokenText)._string._M_string_length = 0;
  args = (BotscriptParser *)&this->m_badTokenText;
  (this->m_badTokenText)._string.field_2._M_local_buf[0] = '\0';
  while( true ) {
    local_30 = parseSymbol(this);
    if (local_30 == (ExpressionSymbol *)0x0) break;
    parser = (BotscriptParser *)&local_30;
    List<ExpressionSymbol_*>::append(this_00,&local_30);
  }
  bVar1 = List<ExpressionSymbol_*>::isEmpty(this_00);
  if (bVar1) {
    error<String>("unknown identifier \'%1\'",(String *)args);
    parser = args;
  }
  adjustOperators(this);
  verify(this,(EVP_PKEY_CTX *)parser,sig,CONCAT44(in_register_0000000c,uVar2),in_R8,in_R9);
  evaluate(this);
  return;
}

Assistant:

Expression::Expression (BotscriptParser* parser, Lexer* lx, DataType reqtype) :
	m_parser (parser),
	m_lexer (lx),
	m_type (reqtype)
{
	ExpressionSymbol* sym;

	while ((sym = parseSymbol()) != null)
		m_symbols << sym;

	// If we were unable to get any expression symbols, something's wonky with
	// the script. Report an error. mBadTokenText is set to the token that
	// ParseSymbol ends at when it returns false.
	if (m_symbols.isEmpty())
		error ("unknown identifier '%1'", m_badTokenText);

	adjustOperators();
	verify();
	evaluate();
}